

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser.cc
# Opt level: O0

bool __thiscall DyndepParser::ParseEdge(DyndepParser *this,string *err)

{
  EvalString *this_00;
  pointer *key_00;
  map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
  *this_01;
  State *pSVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  byte bVar4;
  Edge *pEVar5;
  pointer ppVar6;
  size_type sVar7;
  TokenType *this_02;
  pointer pEVar8;
  ulong uVar9;
  pair<std::_Rb_tree_iterator<std::pair<Edge_*const,_Dyndeps>_>,_bool> pVar10;
  StringPiece local_4e0;
  Node *local_4d0;
  Node *n_1;
  uint64_t slash_bits_2;
  string path_err;
  string local_498;
  undefined1 local_478 [8];
  string path_2;
  __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_> local_450;
  iterator i_1;
  Node *local_438;
  Node *n;
  uint64_t slash_bits_1;
  string local_420;
  undefined1 local_400 [8];
  string path_1;
  __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_> local_3d8;
  iterator i;
  string value;
  string local_3a8;
  undefined1 local_388 [8];
  EvalString val;
  string key;
  string local_348;
  undefined1 local_328 [8];
  EvalString in_1;
  vector<EvalString,_std::allocator<EvalString>_> ins;
  string local_2f0;
  undefined1 local_2d0 [8];
  EvalString in;
  string local_2b0;
  undefined1 local_290 [8];
  string rule_name;
  EvalString out_1;
  vector<EvalString,_std::allocator<EvalString>_> outs;
  string local_238;
  undefined1 local_218 [8];
  EvalString out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  _Base_ptr local_1c0;
  undefined1 local_1b8;
  Dyndeps local_1b0;
  pair<Edge_*const,_Dyndeps> local_178;
  _Rb_tree_iterator<std::pair<Edge_*const,_Dyndeps>_> local_138;
  pair<std::_Rb_tree_iterator<std::pair<Edge_*const,_Dyndeps>_>,_bool> res;
  Edge *edge;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  StringPiece local_e0;
  Node *local_d0;
  Node *node;
  uint64_t slash_bits;
  string local_b8;
  undefined1 local_98 [8];
  string path;
  string local_70;
  uint local_50;
  undefined1 local_40 [8];
  EvalString out0;
  Dyndeps *dyndeps;
  string *err_local;
  DyndepParser *this_local;
  
  out0.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  EvalString::EvalString((EvalString *)local_40);
  bVar3 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_40,err);
  if (bVar3) {
    bVar3 = EvalString::empty((EvalString *)local_40);
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"expected path",
                 (allocator<char> *)(path.field_2._M_local_buf + 0xf));
      this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_70,err);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator((allocator<char> *)(path.field_2._M_local_buf + 0xf));
      local_50 = 1;
    }
    else {
      EvalString::Evaluate_abi_cxx11_
                ((string *)local_98,(EvalString *)local_40,&(this->env_).super_Env);
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        CanonicalizePath((string *)local_98,(uint64_t *)&node);
        pSVar1 = (this->super_Parser).state_;
        StringPiece::StringPiece(&local_e0,(string *)local_98);
        local_d0 = State::LookupNode(pSVar1,local_e0);
        if ((local_d0 == (Node *)0x0) || (pEVar5 = Node::in_edge(local_d0), pEVar5 == (Edge *)0x0))
        {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&edge,
                         "no build statement exists for \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98);
          std::operator+(&local_100,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&edge,
                         "\'");
          this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_100,err);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::~string((string *)&edge);
          local_50 = 1;
        }
        else {
          res._8_8_ = Node::in_edge(local_d0);
          this_01 = &this->dyndep_file_->
                     super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
          ;
          Dyndeps::Dyndeps(&local_1b0);
          std::pair<Edge_*const,_Dyndeps>::pair<Edge_*&,_Dyndeps,_true>
                    (&local_178,(Edge **)&res.second,&local_1b0);
          pVar10 = std::
                   map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                   ::insert(this_01,&local_178);
          local_1c0 = (_Base_ptr)pVar10.first._M_node;
          local_1b8 = pVar10.second;
          local_138._M_node = local_1c0;
          res.first._M_node._0_1_ = local_1b8;
          std::pair<Edge_*const,_Dyndeps>::~pair(&local_178);
          Dyndeps::~Dyndeps(&local_1b0);
          if (((byte)res.first._M_node & 1) == 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &out.parsed_.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           "multiple statements for \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98);
            std::operator+(&local_1e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &out.parsed_.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,"\'");
            this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_1e0,err);
            std::__cxx11::string::~string((string *)&local_1e0);
            std::__cxx11::string::~string
                      ((string *)
                       &out.parsed_.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_50 = 1;
          }
          else {
            ppVar6 = std::_Rb_tree_iterator<std::pair<Edge_*const,_Dyndeps>_>::operator->
                               (&local_138);
            out0.parsed_.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&ppVar6->second;
            local_50 = 0;
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"empty path",(allocator<char> *)((long)&slash_bits + 7));
        this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_b8,err);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&slash_bits + 7));
        local_50 = 1;
      }
      std::__cxx11::string::~string((string *)local_98);
    }
  }
  else {
    this_local._7_1_ = 0;
    local_50 = 1;
  }
  EvalString::~EvalString((EvalString *)local_40);
  if (local_50 != 0) goto LAB_00123508;
  EvalString::EvalString((EvalString *)local_218);
  bVar3 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_218,err);
  if (bVar3) {
    bVar3 = EvalString::empty((EvalString *)local_218);
    if (bVar3) {
      local_50 = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"explicit outputs not supported",
                 (allocator<char> *)
                 ((long)&outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_238,err);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&outs.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      local_50 = 1;
    }
  }
  else {
    this_local._7_1_ = 0;
    local_50 = 1;
  }
  EvalString::~EvalString((EvalString *)local_218);
  if (local_50 != 0) goto LAB_00123508;
  std::vector<EvalString,_std::allocator<EvalString>_>::vector
            ((vector<EvalString,_std::allocator<EvalString>_> *)
             &out_1.parsed_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar3 = Lexer::PeekToken(&(this->super_Parser).lexer_,PIPE);
  if (bVar3) {
    do {
      this_00 = (EvalString *)((long)&rule_name.field_2 + 8);
      EvalString::EvalString(this_00);
      bVar3 = Lexer::ReadPath(&(this->super_Parser).lexer_,this_00,err);
      if (bVar3) {
        bVar3 = EvalString::empty((EvalString *)((long)&rule_name.field_2 + 8));
        if (bVar3) {
          local_50 = 2;
        }
        else {
          std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                    ((vector<EvalString,_std::allocator<EvalString>_> *)
                     &out_1.parsed_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (value_type *)((long)&rule_name.field_2 + 8));
          local_50 = 0;
        }
      }
      else {
        this_local._7_1_ = err != (string *)0x0;
        local_50 = 1;
      }
      EvalString::~EvalString((EvalString *)((long)&rule_name.field_2 + 8));
    } while (local_50 == 0);
    if (local_50 == 2) goto LAB_0012287a;
  }
  else {
LAB_0012287a:
    bVar3 = Parser::ExpectToken(&this->super_Parser,COLON,err);
    if (bVar3) {
      std::__cxx11::string::string((string *)local_290);
      bVar3 = Lexer::ReadIdent(&(this->super_Parser).lexer_,(string *)local_290);
      if ((!bVar3) ||
         (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_290,"dyndep"), bVar3)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b0,"expected build command name \'dyndep\'",
                   (allocator<char> *)
                   ((long)&in.parsed_.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_2b0,err);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&in.parsed_.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        local_50 = 1;
      }
      else {
        EvalString::EvalString((EvalString *)local_2d0);
        bVar3 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_2d0,err);
        if (bVar3) {
          bVar3 = EvalString::empty((EvalString *)local_2d0);
          if (bVar3) {
            local_50 = 0;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2f0,"explicit inputs not supported",
                       (allocator<char> *)
                       ((long)&ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_2f0,err);
            std::__cxx11::string::~string((string *)&local_2f0);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&ins.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            local_50 = 1;
          }
        }
        else {
          this_local._7_1_ = 0;
          local_50 = 1;
        }
        EvalString::~EvalString((EvalString *)local_2d0);
        if (local_50 == 0) {
          std::vector<EvalString,_std::allocator<EvalString>_>::vector
                    ((vector<EvalString,_std::allocator<EvalString>_> *)
                     &in_1.parsed_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar3 = Lexer::PeekToken(&(this->super_Parser).lexer_,PIPE);
          if (bVar3) {
            do {
              EvalString::EvalString((EvalString *)local_328);
              bVar3 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_328,err);
              if (bVar3) {
                bVar3 = EvalString::empty((EvalString *)local_328);
                if (bVar3) {
                  local_50 = 4;
                }
                else {
                  std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                            ((vector<EvalString,_std::allocator<EvalString>_> *)
                             &in_1.parsed_.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (value_type *)local_328);
                  local_50 = 0;
                }
              }
              else {
                this_local._7_1_ = err != (string *)0x0;
                local_50 = 1;
              }
              EvalString::~EvalString((EvalString *)local_328);
            } while (local_50 == 0);
            if (local_50 == 4) goto LAB_00122ca7;
          }
          else {
LAB_00122ca7:
            bVar3 = Lexer::PeekToken(&(this->super_Parser).lexer_,PIPE2);
            if (bVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_348,"order-only inputs not supported",
                         (allocator<char> *)(key.field_2._M_local_buf + 0xf));
              this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_348,err);
              std::__cxx11::string::~string((string *)&local_348);
              std::allocator<char>::~allocator((allocator<char> *)(key.field_2._M_local_buf + 0xf));
              local_50 = 1;
            }
            else {
              bVar3 = Parser::ExpectToken(&this->super_Parser,NEWLINE,err);
              if (bVar3) {
                bVar3 = Lexer::PeekToken(&(this->super_Parser).lexer_,INDENT);
                if (bVar3) {
                  key_00 = &val.parsed_.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  std::__cxx11::string::string((string *)key_00);
                  EvalString::EvalString((EvalString *)local_388);
                  bVar3 = ParseLet(this,(string *)key_00,(EvalString *)local_388,err);
                  if (bVar3) {
                    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&val.parsed_.
                                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                            "restat");
                    if (bVar3) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_3a8,"binding is not \'restat\'",
                                 (allocator<char> *)(value.field_2._M_local_buf + 0xf));
                      this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_3a8,err);
                      std::__cxx11::string::~string((string *)&local_3a8);
                      std::allocator<char>::~allocator
                                ((allocator<char> *)(value.field_2._M_local_buf + 0xf));
                      local_50 = 1;
                    }
                    else {
                      EvalString::Evaluate_abi_cxx11_
                                ((string *)&i,(EvalString *)local_388,&(this->env_).super_Env);
                      bVar4 = std::__cxx11::string::empty();
                      ((out0.parsed_.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).field_0x1 =
                           (bVar4 ^ 0xff) & 1;
                      std::__cxx11::string::~string((string *)&i);
                      local_50 = 0;
                    }
                  }
                  else {
                    this_local._7_1_ = 0;
                    local_50 = 1;
                  }
                  EvalString::~EvalString((EvalString *)local_388);
                  std::__cxx11::string::~string
                            ((string *)
                             &val.parsed_.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  if (local_50 != 0) goto LAB_001234b4;
                }
                pbVar2 = &(out0.parsed_.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->first;
                sVar7 = std::vector<EvalString,_std::allocator<EvalString>_>::size
                                  ((vector<EvalString,_std::allocator<EvalString>_> *)
                                   &in_1.parsed_.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                          ((vector<Node_*,_std::allocator<Node_*>_> *)&pbVar2->_M_string_length,
                           sVar7);
                local_3d8._M_current =
                     (EvalString *)
                     std::vector<EvalString,_std::allocator<EvalString>_>::begin
                               ((vector<EvalString,_std::allocator<EvalString>_> *)
                                &in_1.parsed_.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
                while( true ) {
                  path_1.field_2._8_8_ =
                       std::vector<EvalString,_std::allocator<EvalString>_>::end
                                 ((vector<EvalString,_std::allocator<EvalString>_> *)
                                  &in_1.parsed_.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  bVar3 = __gnu_cxx::operator!=
                                    (&local_3d8,
                                     (__normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>
                                      *)((long)&path_1.field_2 + 8));
                  if (!bVar3) break;
                  pEVar8 = __gnu_cxx::
                           __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>
                           ::operator->(&local_3d8);
                  EvalString::Evaluate_abi_cxx11_
                            ((string *)local_400,pEVar8,&(this->env_).super_Env);
                  uVar9 = std::__cxx11::string::empty();
                  bVar3 = (uVar9 & 1) != 0;
                  if (bVar3) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_420,"empty path",
                               (allocator<char> *)((long)&slash_bits_1 + 7));
                    this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_420,err);
                    std::__cxx11::string::~string((string *)&local_420);
                    std::allocator<char>::~allocator((allocator<char> *)((long)&slash_bits_1 + 7));
                  }
                  else {
                    CanonicalizePath((string *)local_400,(uint64_t *)&n);
                    pSVar1 = (this->super_Parser).state_;
                    StringPiece::StringPiece((StringPiece *)&i_1,(string *)local_400);
                    local_438 = State::GetNode(pSVar1,_i_1,(uint64_t)n);
                    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                              ((vector<Node_*,_std::allocator<Node_*>_> *)
                               &((out0.parsed_.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                                _M_string_length,&local_438);
                  }
                  local_50 = (uint)bVar3;
                  std::__cxx11::string::~string((string *)local_400);
                  if (local_50 != 0) goto LAB_001234b4;
                  __gnu_cxx::
                  __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>
                  ::operator++(&local_3d8);
                }
                this_02 = &(out0.parsed_.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->second;
                sVar7 = std::vector<EvalString,_std::allocator<EvalString>_>::size
                                  ((vector<EvalString,_std::allocator<EvalString>_> *)
                                   &out_1.parsed_.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                          ((vector<Node_*,_std::allocator<Node_*>_> *)this_02,sVar7);
                local_450._M_current =
                     (EvalString *)
                     std::vector<EvalString,_std::allocator<EvalString>_>::begin
                               ((vector<EvalString,_std::allocator<EvalString>_> *)
                                &out_1.parsed_.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
                while( true ) {
                  path_2.field_2._8_8_ =
                       std::vector<EvalString,_std::allocator<EvalString>_>::end
                                 ((vector<EvalString,_std::allocator<EvalString>_> *)
                                  &out_1.parsed_.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  bVar3 = __gnu_cxx::operator!=
                                    (&local_450,
                                     (__normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>
                                      *)((long)&path_2.field_2 + 8));
                  if (!bVar3) break;
                  pEVar8 = __gnu_cxx::
                           __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>
                           ::operator->(&local_450);
                  EvalString::Evaluate_abi_cxx11_
                            ((string *)local_478,pEVar8,&(this->env_).super_Env);
                  uVar9 = std::__cxx11::string::empty();
                  bVar3 = (uVar9 & 1) != 0;
                  if (bVar3) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_498,"empty path",
                               (allocator<char> *)(path_err.field_2._M_local_buf + 0xf));
                    this_local._7_1_ = Lexer::Error(&(this->super_Parser).lexer_,&local_498,err);
                    std::__cxx11::string::~string((string *)&local_498);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)(path_err.field_2._M_local_buf + 0xf));
                  }
                  else {
                    std::__cxx11::string::string((string *)&slash_bits_2);
                    CanonicalizePath((string *)local_478,(uint64_t *)&n_1);
                    pSVar1 = (this->super_Parser).state_;
                    StringPiece::StringPiece(&local_4e0,(string *)local_478);
                    local_4d0 = State::GetNode(pSVar1,local_4e0,(uint64_t)n_1);
                    std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                              ((vector<Node_*,_std::allocator<Node_*>_> *)
                               &(out0.parsed_.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->second,
                               &local_4d0);
                    std::__cxx11::string::~string((string *)&slash_bits_2);
                  }
                  local_50 = (uint)bVar3;
                  std::__cxx11::string::~string((string *)local_478);
                  if (local_50 != 0) goto LAB_001234b4;
                  __gnu_cxx::
                  __normal_iterator<EvalString_*,_std::vector<EvalString,_std::allocator<EvalString>_>_>
                  ::operator++(&local_450);
                }
                this_local._7_1_ = 1;
                local_50 = 1;
              }
              else {
                this_local._7_1_ = 0;
                local_50 = 1;
              }
            }
          }
LAB_001234b4:
          std::vector<EvalString,_std::allocator<EvalString>_>::~vector
                    ((vector<EvalString,_std::allocator<EvalString>_> *)
                     &in_1.parsed_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      std::__cxx11::string::~string((string *)local_290);
    }
    else {
      this_local._7_1_ = 0;
      local_50 = 1;
    }
  }
  std::vector<EvalString,_std::allocator<EvalString>_>::~vector
            ((vector<EvalString,_std::allocator<EvalString>_> *)
             &out_1.parsed_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_00123508:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DyndepParser::ParseEdge(string* err) {
  // Parse one explicit output.  We expect it to already have an edge.
  // We will record its dynamically-discovered dependency information.
  Dyndeps* dyndeps = NULL;
  {
    EvalString out0;
    if (!lexer_.ReadPath(&out0, err))
      return false;
    if (out0.empty())
      return lexer_.Error("expected path", err);

    string path = out0.Evaluate(&env_);
    if (path.empty())
      return lexer_.Error("empty path", err);
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    Node* node = state_->LookupNode(path);
    if (!node || !node->in_edge())
      return lexer_.Error("no build statement exists for '" + path + "'", err);
    Edge* edge = node->in_edge();
    std::pair<DyndepFile::iterator, bool> res =
      dyndep_file_->insert(DyndepFile::value_type(edge, Dyndeps()));
    if (!res.second)
      return lexer_.Error("multiple statements for '" + path + "'", err);
    dyndeps = &res.first->second;
  }

  // Disallow explicit outputs.
  {
    EvalString out;
    if (!lexer_.ReadPath(&out, err))
      return false;
    if (!out.empty())
      return lexer_.Error("explicit outputs not supported", err);
  }

  // Parse implicit outputs, if any.
  vector<EvalString> outs;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString out;
      if (!lexer_.ReadPath(&out, err))
        return err;
      if (out.empty())
        break;
      outs.push_back(out);
    }
  }

  if (!ExpectToken(Lexer::COLON, err))
    return false;

  string rule_name;
  if (!lexer_.ReadIdent(&rule_name) || rule_name != "dyndep")
    return lexer_.Error("expected build command name 'dyndep'", err);

  // Disallow explicit inputs.
  {
    EvalString in;
    if (!lexer_.ReadPath(&in, err))
      return false;
    if (!in.empty())
      return lexer_.Error("explicit inputs not supported", err);
  }

  // Parse implicit inputs, if any.
  vector<EvalString> ins;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return err;
      if (in.empty())
        break;
      ins.push_back(in);
    }
  }

  // Disallow order-only inputs.
  if (lexer_.PeekToken(Lexer::PIPE2))
    return lexer_.Error("order-only inputs not supported", err);

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  if (lexer_.PeekToken(Lexer::INDENT)) {
    string key;
    EvalString val;
    if (!ParseLet(&key, &val, err))
      return false;
    if (key != "restat")
      return lexer_.Error("binding is not 'restat'", err);
    string value = val.Evaluate(&env_);
    dyndeps->restat_ = !value.empty();
  }

  dyndeps->implicit_inputs_.reserve(ins.size());
  for (vector<EvalString>::iterator i = ins.begin(); i != ins.end(); ++i) {
    string path = i->Evaluate(&env_);
    if (path.empty())
      return lexer_.Error("empty path", err);
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    Node* n = state_->GetNode(path, slash_bits);
    dyndeps->implicit_inputs_.push_back(n);
  }

  dyndeps->implicit_outputs_.reserve(outs.size());
  for (vector<EvalString>::iterator i = outs.begin(); i != outs.end(); ++i) {
    string path = i->Evaluate(&env_);
    if (path.empty())
      return lexer_.Error("empty path", err);
    string path_err;
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    Node* n = state_->GetNode(path, slash_bits);
    dyndeps->implicit_outputs_.push_back(n);
  }

  return true;
}